

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

void __thiscall QPDFObjectHandle::rotatePage(QPDFObjectHandle *this,int angle,bool relative)

{
  bool bVar1;
  int iVar2;
  runtime_error *this_00;
  QPDFObjGen og;
  allocator<char> local_b1;
  int local_b0;
  int local_ac;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_a0;
  QPDFObjectHandle cur_obj;
  QPDFObjectHandle local_80 [2];
  set visited;
  
  local_b0 = angle;
  if (angle % 0x5a != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"QPDF::rotatePage called with an angle that is not a multiple of 90");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (relative) {
    local_ac = 0;
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&cur_obj,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this);
    visited.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
    super__Rb_tree_header._M_header._M_left =
         &visited.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
          _M_impl.super__Rb_tree_header._M_header;
    visited.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
    super__Rb_tree_header._M_header._M_color = _S_red;
    visited.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
    super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    visited.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
    super__Rb_tree_header._M_node_count = 0;
    visited.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
    super__Rb_tree_header._M_header._M_right =
         visited.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
         _M_impl.super__Rb_tree_header._M_header._M_left;
    while( true ) {
      if (cur_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr == (element_type *)0x0) {
        og.obj = 0;
        og.gen = 0;
      }
      else {
        og = (cur_obj.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->og;
      }
      bVar1 = QPDFObjGen::set::add(&visited,og);
      if (!bVar1) break;
      std::__cxx11::string::string<std::allocator<char>>((string *)local_80,"/Rotate",&local_b1);
      getKey((QPDFObjectHandle *)&local_a0,(string *)&cur_obj);
      bVar1 = getValueAsInt((QPDFObjectHandle *)&local_a0,&local_ac);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
      std::__cxx11::string::~string((string *)local_80);
      if (bVar1) break;
      std::__cxx11::string::string<std::allocator<char>>((string *)local_80,"/Parent",&local_b1);
      getKey((QPDFObjectHandle *)&local_a0,(string *)&cur_obj);
      bVar1 = isDictionary((QPDFObjectHandle *)&local_a0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
      std::__cxx11::string::~string((string *)local_80);
      if (!bVar1) break;
      std::__cxx11::string::string<std::allocator<char>>((string *)local_80,"/Parent",&local_b1);
      getKey((QPDFObjectHandle *)&local_a0,(string *)&cur_obj);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&cur_obj,&local_a0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
      std::__cxx11::string::~string((string *)local_80);
    }
    iVar2 = 0;
    if (local_ac % 0x5a == 0) {
      iVar2 = local_ac;
    }
    local_b0 = local_b0 + iVar2;
    std::
    _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
    ::~_Rb_tree((_Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                 *)&visited);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&cur_obj.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&visited,"/Rotate",(allocator<char> *)&cur_obj);
  newInteger((longlong)this);
  replaceKey(this,(string *)&visited,local_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_80[0].super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&visited);
  return;
}

Assistant:

void
QPDFObjectHandle::rotatePage(int angle, bool relative)
{
    if ((angle % 90) != 0) {
        throw std::runtime_error(
            "QPDF::rotatePage called with an angle that is not a multiple of 90");
    }
    int new_angle = angle;
    if (relative) {
        int old_angle = 0;
        QPDFObjectHandle cur_obj = *this;
        QPDFObjGen::set visited;
        while (visited.add(cur_obj)) {
            // Don't get stuck in an infinite loop
            if (cur_obj.getKey("/Rotate").getValueAsInt(old_angle)) {
                break;
            } else if (cur_obj.getKey("/Parent").isDictionary()) {
                cur_obj = cur_obj.getKey("/Parent");
            } else {
                break;
            }
        }
        QTC::TC("qpdf", "QPDFObjectHandle found old angle", visited.size() > 1 ? 0 : 1);
        if ((old_angle % 90) != 0) {
            old_angle = 0;
        }
        new_angle += old_angle;
    }
    new_angle = (new_angle + 360) % 360;
    // Make this explicit even with new_angle == 0 since /Rotate can be inherited.
    replaceKey("/Rotate", QPDFObjectHandle::newInteger(new_angle));
}